

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest13::getGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest13 *this,uint n_id)

{
  ostream *poVar1;
  stringstream result_sstream;
  stringstream local_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(&local_188,
                           "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\nsubroutine void SubroutineGSType(inout vec4 result);\n\nsubroutine(SubroutineGSType) void SubroutineGS1(inout vec4 result)\n{\n    result += vec4(0, 0, 0, "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 1) * 0.425);
  poVar1 = std::operator<<(poVar1,
                           ");\n}\nsubroutine(SubroutineGSType) void SubroutineGS2(inout vec4 result)\n{\n    result += vec4(0, 0, 0, "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 1) * 0.0425);
  std::operator<<(poVar1,
                  ");\n}\n\nsubroutine uniform SubroutineGSType function;\n\nin TE_DATA\n{\n    vec4 data;\n} in_te[];\n\nout GS_DATA\n{\n    vec4 data;\n} out_gs;\n\nin gl_PerVertex { vec4 gl_Position; } gl_in[];\nout gl_PerVertex { vec4 gl_Position; };\nvoid main()\n{\n    vec4 data = in_te[0].data;\n\n    function(data);\n\n    gl_Position = vec4(1, -1, 0, 1);\n    out_gs.data = data;\n    EmitVertex();\n\n    gl_Position = vec4(-1, -1, 0, 1);\n    out_gs.data = data;\n    EmitVertex();\n\n    gl_Position = vec4(1, 1, 0, 1);\n    out_gs.data = data;\n    EmitVertex();\n\n    gl_Position = vec4(-1, 1, 0, 1);\n    out_gs.data = data;\n    EmitVertex();\n    EndPrimitive();\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest13::getGeometryShaderBody(unsigned int n_id)
{
	std::stringstream result_sstream;

	/* Pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  "layout(points)                           in;\n"
					  "layout(triangle_strip, max_vertices = 4) out;\n"
					  /* Sub-routine */
					  "subroutine void SubroutineGSType(inout vec4 result);\n"
					  "\n"
					  "subroutine(SubroutineGSType) void SubroutineGS1(inout vec4 result)\n"
					  "{\n"
					  "    result += vec4(0, 0, 0, "
				   << float(n_id + 1) * 0.425f << ");\n"
												  "}\n"
												  "subroutine(SubroutineGSType) void SubroutineGS2(inout vec4 result)\n"
												  "{\n"
												  "    result += vec4(0, 0, 0, "
				   << float(n_id + 1) * 0.0425f << ");\n"
												   "}\n"
												   "\n"
												   "subroutine uniform SubroutineGSType function;\n"
												   "\n"
												   /* Input block */
												   "in TE_DATA\n"
												   "{\n"
												   "    vec4 data;\n"
												   "} in_te[];\n"
												   "\n"
												   /* Output block */
												   "out GS_DATA\n"
												   "{\n"
												   "    vec4 data;\n"
												   "} out_gs;\n"
												   "\n"
												   "in gl_PerVertex { vec4 gl_Position; } gl_in[];\n"
												   "out gl_PerVertex { vec4 gl_Position; };\n"
												   /* main() declaration */
												   "void main()\n"
												   "{\n"
												   "    vec4 data = in_te[0].data;\n"
												   "\n"
												   "    function(data);\n"
												   "\n"
												   "    gl_Position = vec4(1, -1, 0, 1);\n"
												   "    out_gs.data = data;\n"
												   "    EmitVertex();\n"
												   "\n"
												   "    gl_Position = vec4(-1, -1, 0, 1);\n"
												   "    out_gs.data = data;\n"
												   "    EmitVertex();\n"
												   "\n"
												   "    gl_Position = vec4(1, 1, 0, 1);\n"
												   "    out_gs.data = data;\n"
												   "    EmitVertex();\n"
												   "\n"
												   "    gl_Position = vec4(-1, 1, 0, 1);\n"
												   "    out_gs.data = data;\n"
												   "    EmitVertex();\n"
												   "    EndPrimitive();\n"
												   "}\n";

	return result_sstream.str();
}